

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProperty.hh
# Opt level: O2

void __thiscall OpenMesh::BaseProperty::~BaseProperty(BaseProperty *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~BaseProperty() {}